

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

string * __thiscall
google::protobuf::io::(anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
          (CommentCollector *this)

{
  if ((this[0x3d] == (CommentCollector)0x1) && (this[0x3e] == (CommentCollector)0x0)) {
    anon_unknown_0::CommentCollector::Flush((CommentCollector *)this);
  }
  *(undefined2 *)(this + 0x3d) = 0x101;
  return (string *)(this + 0x18);
}

Assistant:

std::string* GetBufferForLineComment() {
    // We want to combine with previous line comments, but not block comments.
    if (has_comment_ && !is_line_comment_) {
      Flush();
    }
    has_comment_ = true;
    is_line_comment_ = true;
    return &comment_buffer_;
  }